

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# polevl.c
# Opt level: O0

double polevl(double x,double *coef,int N)

{
  double *local_38;
  double *p;
  double dStack_28;
  int i;
  double ans;
  int N_local;
  double *coef_local;
  double x_local;
  
  dStack_28 = *coef;
  local_38 = coef + 1;
  p._4_4_ = N;
  do {
    dStack_28 = dStack_28 * x + *local_38;
    p._4_4_ = p._4_4_ + -1;
    local_38 = local_38 + 1;
  } while (p._4_4_ != 0);
  return dStack_28;
}

Assistant:

double polevl( x, coef, N )
double x;
double coef[];
int N;
{
double ans;
int i;
double *p;

p = coef;
ans = *p++;
i = N;

do
	ans = ans * x  +  *p++;
while( --i );

return( ans );
}